

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void initShellData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  QMultiHash<char,_QLatin1String> QStack_d08;
  pair<char,_QLatin1String> local_cf8;
  undefined1 local_ce0;
  undefined8 local_cd8;
  char *local_cd0;
  undefined1 local_cc8;
  undefined8 local_cc0;
  char *local_cb8;
  undefined1 local_cb0;
  undefined8 local_ca8;
  char *local_ca0;
  undefined1 local_c98;
  undefined8 local_c90;
  char *local_c88;
  undefined1 local_c80;
  undefined8 local_c78;
  char *local_c70;
  undefined1 local_c68;
  undefined8 local_c60;
  char *local_c58;
  undefined1 local_c50;
  undefined8 local_c48;
  char *local_c40;
  undefined1 local_c38;
  undefined8 local_c30;
  char *local_c28;
  undefined1 local_c20;
  undefined8 local_c18;
  char *local_c10;
  undefined1 local_c08;
  undefined8 local_c00;
  char *local_bf8;
  undefined1 local_bf0;
  undefined8 local_be8;
  char *local_be0;
  undefined1 local_bd8;
  undefined8 local_bd0;
  char *local_bc8;
  undefined1 local_bc0;
  undefined8 local_bb8;
  char *local_bb0;
  undefined1 local_ba8;
  undefined8 local_ba0;
  char *local_b98;
  undefined1 local_b90;
  undefined8 local_b88;
  char *local_b80;
  undefined1 local_b78;
  undefined8 local_b70;
  char *local_b68;
  undefined1 local_b60;
  undefined8 local_b58;
  char *local_b50;
  undefined1 local_b48;
  undefined8 local_b40;
  char *local_b38;
  undefined1 local_b30;
  undefined8 local_b28;
  char *local_b20;
  undefined1 local_b18;
  undefined8 local_b10;
  char *local_b08;
  undefined1 local_b00;
  undefined8 local_af8;
  char *local_af0;
  undefined1 local_ae8;
  undefined8 local_ae0;
  char *local_ad8;
  undefined1 local_ad0;
  undefined8 local_ac8;
  char *local_ac0;
  undefined1 local_ab8;
  undefined8 local_ab0;
  char *local_aa8;
  undefined1 local_aa0;
  undefined8 local_a98;
  char *local_a90;
  undefined1 local_a88;
  undefined8 local_a80;
  char *local_a78;
  undefined1 local_a70;
  undefined8 local_a68;
  char *local_a60;
  undefined1 local_a58;
  undefined8 local_a50;
  char *local_a48;
  undefined1 local_a40;
  undefined8 local_a38;
  char *local_a30;
  undefined1 local_a28;
  undefined8 local_a20;
  char *local_a18;
  undefined1 local_a10;
  undefined8 local_a08;
  char *local_a00;
  undefined1 local_9f8;
  undefined8 local_9f0;
  char *local_9e8;
  undefined1 local_9e0;
  undefined8 local_9d8;
  char *local_9d0;
  undefined1 local_9c8;
  undefined8 local_9c0;
  char *local_9b8;
  undefined1 local_9b0;
  undefined8 local_9a8;
  char *local_9a0;
  undefined1 local_998;
  undefined8 local_990;
  char *local_988;
  undefined1 local_980;
  undefined8 local_978;
  char *local_970;
  undefined1 local_968;
  undefined8 local_960;
  char *local_958;
  undefined1 local_950;
  undefined8 local_948;
  char *local_940;
  undefined1 local_938;
  undefined8 local_930;
  char *local_928;
  undefined1 local_920;
  undefined8 local_918;
  char *local_910;
  undefined1 local_908;
  undefined8 local_900;
  char *local_8f8;
  undefined1 local_8f0;
  undefined8 local_8e8;
  char *local_8e0;
  undefined1 local_8d8;
  undefined8 local_8d0;
  char *local_8c8;
  undefined1 local_8c0;
  undefined8 local_8b8;
  char *local_8b0;
  undefined1 local_8a8;
  undefined8 local_8a0;
  char *local_898;
  undefined1 local_890;
  undefined8 local_888;
  char *local_880;
  undefined1 local_878;
  undefined8 local_870;
  char *local_868;
  undefined1 local_860;
  undefined8 local_858;
  char *local_850;
  undefined1 local_848;
  undefined8 local_840;
  char *local_838;
  undefined1 local_830;
  undefined8 local_828;
  char *local_820;
  undefined1 local_818;
  undefined8 local_810;
  char *local_808;
  undefined1 local_800;
  undefined8 local_7f8;
  char *local_7f0;
  undefined1 local_7e8;
  undefined8 local_7e0;
  char *local_7d8;
  undefined1 local_7d0;
  undefined8 local_7c8;
  char *local_7c0;
  undefined1 local_7b8;
  undefined8 local_7b0;
  char *local_7a8;
  undefined1 local_7a0;
  undefined8 local_798;
  char *local_790;
  undefined1 local_788;
  undefined8 local_780;
  char *local_778;
  undefined1 local_770;
  undefined8 local_768;
  char *local_760;
  undefined1 local_758;
  undefined8 local_750;
  char *local_748;
  undefined1 local_740;
  undefined8 local_738;
  char *local_730;
  undefined1 local_728;
  undefined8 local_720;
  char *local_718;
  undefined1 local_710;
  undefined8 local_708;
  char *local_700;
  undefined1 local_6f8;
  undefined8 local_6f0;
  char *local_6e8;
  undefined1 local_6e0;
  undefined8 local_6d8;
  char *local_6d0;
  undefined1 local_6c8;
  undefined8 local_6c0;
  char *local_6b8;
  undefined1 local_6b0;
  undefined8 local_6a8;
  char *local_6a0;
  undefined1 local_698;
  undefined8 local_690;
  char *local_688;
  undefined1 local_680;
  undefined8 local_678;
  char *local_670;
  undefined1 local_668;
  undefined8 local_660;
  char *local_658;
  undefined1 local_650;
  undefined8 local_648;
  char *local_640;
  undefined1 local_638;
  undefined8 local_630;
  char *local_628;
  undefined1 local_620;
  undefined8 local_618;
  char *local_610;
  undefined1 local_608;
  undefined8 local_600;
  char *local_5f8;
  undefined1 local_5f0;
  undefined8 local_5e8;
  char *local_5e0;
  undefined1 local_5d8;
  undefined8 local_5d0;
  char *local_5c8;
  undefined1 local_5c0;
  undefined8 local_5b8;
  char *local_5b0;
  undefined1 local_5a8;
  undefined8 local_5a0;
  char *local_598;
  undefined1 local_590;
  undefined8 local_588;
  char *local_580;
  undefined1 local_578;
  undefined8 local_570;
  char *local_568;
  undefined1 local_560;
  undefined8 local_558;
  char *local_550;
  undefined1 local_548;
  undefined8 local_540;
  char *local_538;
  undefined1 local_530;
  undefined8 local_528;
  char *local_520;
  undefined1 local_518;
  undefined8 local_510;
  char *local_508;
  undefined1 local_500;
  undefined8 local_4f8;
  char *local_4f0;
  undefined1 local_4e8;
  undefined8 local_4e0;
  char *local_4d8;
  undefined1 local_4d0;
  undefined8 local_4c8;
  char *local_4c0;
  undefined1 local_4b8;
  undefined8 local_4b0;
  char *local_4a8;
  undefined1 local_4a0;
  undefined8 local_498;
  char *local_490;
  undefined1 local_488;
  undefined8 local_480;
  char *local_478;
  undefined1 local_470;
  undefined8 local_468;
  char *local_460;
  undefined1 local_458;
  undefined8 local_450;
  char *local_448;
  undefined1 local_440;
  undefined8 local_438;
  char *local_430;
  undefined1 local_428;
  undefined8 local_420;
  char *local_418;
  undefined1 local_410;
  undefined8 local_408;
  char *local_400;
  undefined1 local_3f8;
  undefined8 local_3f0;
  char *local_3e8;
  undefined1 local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  undefined1 local_3c8;
  undefined8 local_3c0;
  char *local_3b8;
  undefined1 local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined1 local_398;
  undefined8 local_390;
  char *local_388;
  undefined1 local_380;
  undefined8 local_378;
  char *local_370;
  undefined1 local_368;
  undefined8 local_360;
  char *local_358;
  undefined1 local_350;
  undefined8 local_348;
  char *local_340;
  undefined1 local_338;
  undefined8 local_330;
  char *local_328;
  undefined1 local_320;
  undefined8 local_318;
  char *local_310;
  undefined1 local_308;
  undefined8 local_300;
  char *local_2f8;
  undefined1 local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  undefined1 local_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  undefined1 local_2c0;
  undefined8 local_2b8;
  char *local_2b0;
  undefined1 local_2a8;
  undefined8 local_2a0;
  char *local_298;
  undefined1 local_290;
  undefined8 local_288;
  char *local_280;
  undefined1 local_278;
  undefined8 local_270;
  char *local_268;
  undefined1 local_260;
  undefined8 local_258;
  char *local_250;
  undefined1 local_248;
  undefined8 local_240;
  char *local_238;
  undefined1 local_230;
  undefined8 local_228;
  char *local_220;
  undefined1 local_218;
  undefined8 local_210;
  char *local_208;
  undefined1 local_200;
  undefined8 local_1f8;
  char *local_1f0;
  undefined1 local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined1 local_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  undefined1 local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined1 local_1a0;
  undefined8 local_198;
  char *local_190;
  undefined1 local_188;
  undefined8 local_180;
  char *local_178;
  undefined1 local_170;
  undefined8 local_168;
  char *local_160;
  undefined1 local_158;
  undefined8 local_150;
  char *local_148;
  undefined1 local_140;
  undefined8 local_138;
  char *local_130;
  undefined1 local_128;
  undefined8 local_120;
  char *local_118;
  undefined1 local_110;
  undefined8 local_108;
  char *local_100;
  undefined1 local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined1 local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined1 local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined1 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined1 local_98;
  undefined8 local_90;
  char *local_88;
  undefined1 local_80;
  undefined8 local_78;
  char *local_70;
  undefined1 local_68;
  undefined8 local_60;
  char *local_58;
  undefined1 local_50;
  undefined8 local_48;
  char *local_40;
  
  local_cf8.first = 'i';
  local_cf8.second.m_size = 2;
  local_cf8.second.m_data = "if";
  local_ce0 = 0x74;
  local_cd8 = 4;
  local_cd0 = "then";
  local_cc8 = 0x65;
  local_cc0 = 4;
  local_cb8 = "else";
  local_cb0 = 0x65;
  local_ca8 = 4;
  local_ca0 = "elif";
  local_c98 = 0x66;
  local_c90 = 2;
  local_c88 = "fi";
  local_c80 = 0x66;
  local_c78 = 3;
  local_c70 = "for";
  local_c68 = 0x77;
  local_c60 = 5;
  local_c58 = "while";
  local_c50 = 0x69;
  local_c48 = 2;
  local_c40 = "in";
  local_c38 = 100;
  local_c30 = 2;
  local_c28 = "do";
  local_c20 = 100;
  local_c18 = 4;
  local_c10 = "done";
  local_c08 = 99;
  local_c00 = 4;
  local_bf8 = "case";
  local_bf0 = 0x65;
  local_be8 = 4;
  local_be0 = "esac";
  local_bd8 = 0x66;
  local_bd0 = 8;
  local_bc8 = "function";
  list._M_len = 0xd;
  list._M_array = &local_cf8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_d08,list);
  QMultiHash<char,_QLatin1String>::operator=(&shell_keywords,&QStack_d08);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_d08);
  local_cf8.first = '\0';
  local_cf8._1_7_ = 0;
  local_cf8.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&shell_types,(QMultiHash<char,_QLatin1String> *)&local_cf8);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_cf8);
  local_cf8.first = 'f';
  local_cf8.second.m_size = 5;
  local_cf8.second.m_data = "false";
  local_ce0 = 0x74;
  local_cd8 = 4;
  local_cd0 = "true";
  list_00._M_len = 2;
  list_00._M_array = &local_cf8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_d08,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&shell_literals,&QStack_d08);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_d08);
  local_cf8.first = 'b';
  local_cf8.second.m_size = 5;
  local_cf8.second.m_data = "break";
  local_ce0 = 99;
  local_cd8 = 2;
  local_cd0 = "cd";
  local_cc8 = 99;
  local_cc0 = 8;
  local_cb8 = "continue";
  local_cb0 = 0x65;
  local_ca8 = 4;
  local_ca0 = "eval";
  local_c98 = 0x65;
  local_c90 = 4;
  local_c88 = "exec";
  local_c80 = 0x65;
  local_c78 = 4;
  local_c70 = "exit";
  local_c68 = 0x65;
  local_c60 = 6;
  local_c58 = "export";
  local_c50 = 0x67;
  local_c48 = 7;
  local_c40 = "getopts";
  local_c38 = 0x68;
  local_c30 = 4;
  local_c28 = "hash";
  local_c20 = 0x70;
  local_c18 = 3;
  local_c10 = "pwd";
  local_c08 = 0x72;
  local_c00 = 8;
  local_bf8 = "readonly";
  local_bf0 = 0x72;
  local_be8 = 6;
  local_be0 = "return";
  local_bd8 = 0x73;
  local_bd0 = 5;
  local_bc8 = "shift";
  local_bc0 = 0x74;
  local_bb8 = 4;
  local_bb0 = "test";
  local_ba8 = 0x74;
  local_ba0 = 9;
  local_b98 = "timestrap";
  local_b90 = 0x75;
  local_b88 = 5;
  local_b80 = "umask";
  local_b78 = 0x75;
  local_b70 = 5;
  local_b68 = "unset";
  local_b60 = 0x42;
  local_b58 = 4;
  local_b50 = "Bash";
  local_b48 = 0x61;
  local_b40 = 5;
  local_b38 = "alias";
  local_b30 = 0x62;
  local_b28 = 4;
  local_b20 = "bind";
  local_b18 = 0x62;
  local_b10 = 7;
  local_b08 = "builtin";
  local_b00 = 99;
  local_af8 = 6;
  local_af0 = "caller";
  local_ae8 = 99;
  local_ae0 = 7;
  local_ad8 = "command";
  local_ad0 = 100;
  local_ac8 = 7;
  local_ac0 = "declare";
  local_ab8 = 0x65;
  local_ab0 = 4;
  local_aa8 = "echo";
  local_aa0 = 0x65;
  local_a98 = 6;
  local_a90 = "enable";
  local_a88 = 0x68;
  local_a80 = 4;
  local_a78 = "help";
  local_a70 = 0x6c;
  local_a68 = 3;
  local_a60 = "let";
  local_a58 = 0x6c;
  local_a50 = 5;
  local_a48 = "local";
  local_a40 = 0x6c;
  local_a38 = 6;
  local_a30 = "logout";
  local_a28 = 0x6d;
  local_a20 = 7;
  local_a18 = "mapfile";
  local_a10 = 0x70;
  local_a08 = 10;
  local_a00 = "printfread";
  local_9f8 = 0x72;
  local_9f0 = 9;
  local_9e8 = "readarray";
  local_9e0 = 0x73;
  local_9d8 = 6;
  local_9d0 = "source";
  local_9c8 = 0x74;
  local_9c0 = 4;
  local_9b8 = "type";
  local_9b0 = 0x74;
  local_9a8 = 7;
  local_9a0 = "typeset";
  local_998 = 0x75;
  local_990 = 6;
  local_988 = "ulimit";
  local_980 = 0x75;
  local_978 = 7;
  local_970 = "unalias";
  local_968 = 0x6d;
  local_960 = 9;
  local_958 = "modifiers";
  local_950 = 0x73;
  local_948 = 3;
  local_940 = "set";
  local_938 = 0x73;
  local_930 = 5;
  local_928 = "shopt";
  local_920 = 0x61;
  local_918 = 8;
  local_910 = "autoload";
  local_908 = 0x62;
  local_900 = 2;
  local_8f8 = "bg";
  local_8f0 = 0x62;
  local_8e8 = 7;
  local_8e0 = "bindkey";
  local_8d8 = 0x62;
  local_8d0 = 3;
  local_8c8 = "bye";
  local_8c0 = 99;
  local_8b8 = 3;
  local_8b0 = "cap";
  local_8a8 = 99;
  local_8a0 = 5;
  local_898 = "chdir";
  local_890 = 99;
  local_888 = 5;
  local_880 = "clone";
  local_878 = 99;
  local_870 = 0xd;
  local_868 = "comparguments";
  local_860 = 99;
  local_858 = 8;
  local_850 = "compcall";
  local_848 = 99;
  local_840 = 7;
  local_838 = "compctl";
  local_830 = 99;
  local_828 = 0xc;
  local_820 = "compdescribe";
  local_818 = 99;
  local_810 = 0x13;
  local_808 = "compfilescompgroups";
  local_800 = 99;
  local_7f8 = 9;
  local_7f0 = "compquote";
  local_7e8 = 99;
  local_7e0 = 8;
  local_7d8 = "comptags";
  local_7d0 = 99;
  local_7c8 = 7;
  local_7c0 = "comptry";
  local_7b8 = 99;
  local_7b0 = 10;
  local_7a8 = "compvalues";
  local_7a0 = 100;
  local_798 = 4;
  local_790 = "dirs";
  local_788 = 100;
  local_780 = 7;
  local_778 = "disable";
  local_770 = 100;
  local_768 = 6;
  local_760 = "disown";
  local_758 = 0x65;
  local_750 = 6;
  local_748 = "echotc";
  local_740 = 0x65;
  local_738 = 6;
  local_730 = "echoti";
  local_728 = 0x65;
  local_720 = 9;
  local_718 = "emulatefc";
  local_710 = 0x66;
  local_708 = 2;
  local_700 = "fg";
  local_6f8 = 0x66;
  local_6f0 = 5;
  local_6e8 = "float";
  local_6e0 = 0x66;
  local_6d8 = 9;
  local_6d0 = "functions";
  local_6c8 = 0x67;
  local_6c0 = 6;
  local_6b8 = "getcap";
  local_6b0 = 0x67;
  local_6a8 = 5;
  local_6a0 = "getln";
  local_698 = 0x68;
  local_690 = 7;
  local_688 = "history";
  local_680 = 0x69;
  local_678 = 7;
  local_670 = "integer";
  local_668 = 0x6a;
  local_660 = 4;
  local_658 = "jobs";
  local_650 = 0x6b;
  local_648 = 4;
  local_640 = "kill";
  local_638 = 0x6c;
  local_630 = 5;
  local_628 = "limit";
  local_620 = 0x6c;
  local_618 = 3;
  local_610 = "log";
  local_608 = 0x6e;
  local_600 = 6;
  local_5f8 = "noglob";
  local_5f0 = 0x70;
  local_5e8 = 4;
  local_5e0 = "popd";
  local_5d8 = 0x70;
  local_5d0 = 10;
  local_5c8 = "printpushd";
  local_5c0 = 0x70;
  local_5b8 = 6;
  local_5b0 = "pushln";
  local_5a8 = 0x72;
  local_5a0 = 6;
  local_598 = "rehash";
  local_590 = 0x73;
  local_588 = 5;
  local_580 = "sched";
  local_578 = 0x73;
  local_570 = 6;
  local_568 = "setcap";
  local_560 = 0x73;
  local_558 = 6;
  local_550 = "setopt";
  local_548 = 0x73;
  local_540 = 4;
  local_538 = "stat";
  local_530 = 0x73;
  local_528 = 7;
  local_520 = "suspend";
  local_518 = 0x74;
  local_510 = 6;
  local_508 = "ttyctl";
  local_500 = 0x75;
  local_4f8 = 10;
  local_4f0 = "unfunction";
  local_4e8 = 0x75;
  local_4e0 = 6;
  local_4d8 = "unhash";
  local_4d0 = 0x75;
  local_4c8 = 0xf;
  local_4c0 = "unlimitunsetopt";
  local_4b8 = 0x76;
  local_4b0 = 5;
  local_4a8 = "vared";
  local_4a0 = 0x77;
  local_498 = 4;
  local_490 = "wait";
  local_488 = 0x77;
  local_480 = 6;
  local_478 = "whence";
  local_470 = 0x77;
  local_468 = 5;
  local_460 = "where";
  local_458 = 0x77;
  local_450 = 5;
  local_448 = "which";
  local_440 = 0x7a;
  local_438 = 8;
  local_430 = "zcompile";
  local_428 = 0x7a;
  local_420 = 7;
  local_418 = "zformat";
  local_410 = 0x7a;
  local_408 = 4;
  local_400 = "zftp";
  local_3f8 = 0x7a;
  local_3f0 = 3;
  local_3e8 = "zle";
  local_3e0 = 0x7a;
  local_3d8 = 8;
  local_3d0 = "zmodload";
  local_3c8 = 0x7a;
  local_3c0 = 10;
  local_3b8 = "zparseopts";
  local_3b0 = 0x7a;
  local_3a8 = 5;
  local_3a0 = "zprof";
  local_398 = 0x7a;
  local_390 = 4;
  local_388 = "zpty";
  local_380 = 0x7a;
  local_378 = 0xb;
  local_370 = "zregexparse";
  local_368 = 0x7a;
  local_360 = 7;
  local_358 = "zsocket";
  local_350 = 0x7a;
  local_348 = 6;
  local_340 = "zstyle";
  local_338 = 0x7a;
  local_330 = 4;
  local_328 = "ztcp";
  local_320 = 0x67;
  local_318 = 3;
  local_310 = "git";
  local_308 = 0x72;
  local_300 = 2;
  local_2f8 = "rm";
  local_2f0 = 0x73;
  local_2e8 = 4;
  local_2e0 = "sudo";
  local_2d8 = 0x66;
  local_2d0 = 5;
  local_2c8 = "fdisk";
  local_2c0 = 0x61;
  local_2b8 = 3;
  local_2b0 = "apt";
  local_2a8 = 0x73;
  local_2a0 = 4;
  local_298 = "snap";
  local_290 = 0x66;
  local_288 = 7;
  local_280 = "flatpak";
  local_278 = 0x73;
  local_270 = 9;
  local_268 = "snapcraft";
  local_260 = 0x79;
  local_258 = 6;
  local_250 = "yaourt";
  local_248 = 0x6e;
  local_240 = 5;
  local_238 = "nmcli";
  local_230 = 0x70;
  local_228 = 6;
  local_220 = "pacman";
  local_218 = 0x70;
  local_210 = 5;
  local_208 = "pamac";
  local_200 = 0x66;
  local_1f8 = 4;
  local_1f0 = "fsck";
  local_1e8 = 0x6d;
  local_1e0 = 5;
  local_1d8 = "mount";
  local_1d0 = 0x6d;
  local_1c8 = 5;
  local_1c0 = "mkdir";
  local_1b8 = 0x6d;
  local_1b0 = 6;
  local_1a8 = "mkswap";
  local_1a0 = 0x73;
  local_198 = 5;
  local_190 = "sleep";
  local_188 = 0x6c;
  local_180 = 2;
  local_178 = "ls";
  local_170 = 0x77;
  local_168 = 4;
  local_160 = "wget";
  local_158 = 0x6b;
  local_150 = 4;
  local_148 = "kill";
  local_140 = 0x6b;
  local_138 = 7;
  local_130 = "killall";
  local_128 = 0x67;
  local_120 = 3;
  local_118 = "gdb";
  local_110 = 0x51;
  local_108 = 9;
  local_100 = "QOwnNotes";
  local_f8 = 0x71;
  local_f0 = 9;
  local_e8 = "qownnotes";
  local_e0 = 100;
  local_d8 = 6;
  local_d0 = "docker";
  local_c8 = 0x6f;
  local_c0 = 7;
  local_b8 = "openssl";
  local_b0 = 0x70;
  local_a8 = 3;
  local_a0 = "php";
  local_98 = 0x70;
  local_90 = 6;
  local_88 = "python";
  local_80 = 0x70;
  local_78 = 4;
  local_70 = "perl";
  local_68 = 0x67;
  local_60 = 2;
  local_58 = "go";
  local_50 = 99;
  local_48 = 4;
  local_40 = "curl";
  list_01._M_len = 0x88;
  list_01._M_array = &local_cf8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_d08,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&shell_builtin,&QStack_d08);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_d08);
  local_cf8.first = '\0';
  local_cf8._1_7_ = 0;
  local_cf8.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&shell_other,(QMultiHash<char,_QLatin1String> *)&local_cf8);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_cf8);
  return;
}

Assistant:

void initShellData() {
    shell_keywords = {
        {('i'), QLatin1String("if")},      {('t'), QLatin1String("then")},
        {('e'), QLatin1String("else")},    {('e'), QLatin1String("elif")},
        {('f'), QLatin1String("fi")},      {('f'), QLatin1String("for")},
        {('w'), QLatin1String("while")},   {('i'), QLatin1String("in")},
        {('d'), QLatin1String("do")},      {('d'), QLatin1String("done")},
        {('c'), QLatin1String("case")},    {('e'), QLatin1String("esac")},
        {('f'), QLatin1String("function")}};

    shell_types = {};

    shell_literals = {{('f'), QLatin1String("false")},
                      {('t'), QLatin1String("true")}};

    shell_builtin = {{('b'), QLatin1String("break")},
                     {('c'), QLatin1String("cd")},
                     {('c'), QLatin1String("continue")},
                     {('e'), QLatin1String("eval")},
                     {('e'), QLatin1String("exec")},
                     {('e'), QLatin1String("exit")},
                     {('e'), QLatin1String("export")},
                     {('g'), QLatin1String("getopts")},
                     {('h'), QLatin1String("hash")},
                     {('p'), QLatin1String("pwd")},
                     {('r'), QLatin1String("readonly")},
                     {('r'), QLatin1String("return")},
                     {('s'), QLatin1String("shift")},
                     {('t'), QLatin1String("test")},
                     {('t'), QLatin1String("timestrap")},
                     {('u'), QLatin1String("umask")},
                     {('u'), QLatin1String("unset")},
                     {('B'), QLatin1String("Bash")},
                     {('a'), QLatin1String("alias")},
                     {('b'), QLatin1String("bind")},
                     {('b'), QLatin1String("builtin")},
                     {('c'), QLatin1String("caller")},
                     {('c'), QLatin1String("command")},
                     {('d'), QLatin1String("declare")},
                     {('e'), QLatin1String("echo")},
                     {('e'), QLatin1String("enable")},
                     {('h'), QLatin1String("help")},
                     {('l'), QLatin1String("let")},
                     {('l'), QLatin1String("local")},
                     {('l'), QLatin1String("logout")},
                     {('m'), QLatin1String("mapfile")},
                     {('p'), QLatin1String("printfread")},
                     {('r'), QLatin1String("readarray")},
                     {('s'), QLatin1String("source")},
                     {('t'), QLatin1String("type")},
                     {('t'), QLatin1String("typeset")},
                     {('u'), QLatin1String("ulimit")},
                     {('u'), QLatin1String("unalias")},
                     {('m'), QLatin1String("modifiers")},
                     {('s'), QLatin1String("set")},
                     {('s'), QLatin1String("shopt")},
                     {('a'), QLatin1String("autoload")},
                     {('b'), QLatin1String("bg")},
                     {('b'), QLatin1String("bindkey")},
                     {('b'), QLatin1String("bye")},
                     {('c'), QLatin1String("cap")},
                     {('c'), QLatin1String("chdir")},
                     {('c'), QLatin1String("clone")},
                     {('c'), QLatin1String("comparguments")},
                     {('c'), QLatin1String("compcall")},
                     {('c'), QLatin1String("compctl")},
                     {('c'), QLatin1String("compdescribe")},
                     {('c'), QLatin1String("compfilescompgroups")},
                     {('c'), QLatin1String("compquote")},
                     {('c'), QLatin1String("comptags")},
                     {('c'), QLatin1String("comptry")},
                     {('c'), QLatin1String("compvalues")},
                     {('d'), QLatin1String("dirs")},
                     {('d'), QLatin1String("disable")},
                     {('d'), QLatin1String("disown")},
                     {('e'), QLatin1String("echotc")},
                     {('e'), QLatin1String("echoti")},
                     {('e'), QLatin1String("emulatefc")},
                     {('f'), QLatin1String("fg")},
                     {('f'), QLatin1String("float")},
                     {('f'), QLatin1String("functions")},
                     {('g'), QLatin1String("getcap")},
                     {('g'), QLatin1String("getln")},
                     {('h'), QLatin1String("history")},
                     {('i'), QLatin1String("integer")},
                     {('j'), QLatin1String("jobs")},
                     {('k'), QLatin1String("kill")},
                     {('l'), QLatin1String("limit")},
                     {('l'), QLatin1String("log")},
                     {('n'), QLatin1String("noglob")},
                     {('p'), QLatin1String("popd")},
                     {('p'), QLatin1String("printpushd")},
                     {('p'), QLatin1String("pushln")},
                     {('r'), QLatin1String("rehash")},
                     {('s'), QLatin1String("sched")},
                     {('s'), QLatin1String("setcap")},
                     {('s'), QLatin1String("setopt")},
                     {('s'), QLatin1String("stat")},
                     {('s'), QLatin1String("suspend")},
                     {('t'), QLatin1String("ttyctl")},
                     {('u'), QLatin1String("unfunction")},
                     {('u'), QLatin1String("unhash")},
                     {('u'), QLatin1String("unlimitunsetopt")},
                     {('v'), QLatin1String("vared")},
                     {('w'), QLatin1String("wait")},
                     {('w'), QLatin1String("whence")},
                     {('w'), QLatin1String("where")},
                     {('w'), QLatin1String("which")},
                     {('z'), QLatin1String("zcompile")},
                     {('z'), QLatin1String("zformat")},
                     {('z'), QLatin1String("zftp")},
                     {('z'), QLatin1String("zle")},
                     {('z'), QLatin1String("zmodload")},
                     {('z'), QLatin1String("zparseopts")},
                     {('z'), QLatin1String("zprof")},
                     {('z'), QLatin1String("zpty")},
                     {('z'), QLatin1String("zregexparse")},
                     {('z'), QLatin1String("zsocket")},
                     {('z'), QLatin1String("zstyle")},
                     {('z'), QLatin1String("ztcp")},
                     {('g'), QLatin1String("git")},
                     {('r'), QLatin1String("rm")},
                     {('s'), QLatin1String("sudo")},
                     {('f'), QLatin1String("fdisk")},
                     {('a'), QLatin1String("apt")},
                     {('s'), QLatin1String("snap")},
                     {('f'), QLatin1String("flatpak")},
                     {('s'), QLatin1String("snapcraft")},
                     {('y'), QLatin1String("yaourt")},
                     {('n'), QLatin1String("nmcli")},
                     {('p'), QLatin1String("pacman")},
                     {('p'), QLatin1String("pamac")},
                     {('f'), QLatin1String("fsck")},
                     {('m'), QLatin1String("mount")},
                     {('m'), QLatin1String("mkdir")},
                     {('m'), QLatin1String("mkswap")},
                     {('s'), QLatin1String("sleep")},
                     {('l'), QLatin1String("ls")},
                     {('w'), QLatin1String("wget")},
                     {('k'), QLatin1String("kill")},
                     {('k'), QLatin1String("killall")},
                     {('g'), QLatin1String("gdb")},
                     {('Q'), QLatin1String("QOwnNotes")},
                     {('q'), QLatin1String("qownnotes")},
                     {('d'), QLatin1String("docker")},
                     {('o'), QLatin1String("openssl")},
                     {('p'), QLatin1String("php")},
                     {('p'), QLatin1String("python")},
                     {('p'), QLatin1String("perl")},
                     {('g'), QLatin1String("go")},
                     {('c'), QLatin1String("curl")}};

    shell_other = {};
}